

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request,
              uint16_t *compress_algos,size_t num_compress_algos)

{
  ptls_buffer_t *buf;
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  ptls_message_emitter_t *ppVar5;
  undefined1 local_61;
  ptls_message_emitter_t *local_60;
  size_t local_58;
  ptls_key_schedule_t *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar1 = (*emitter->begin_message)(emitter);
  if (iVar1 == 0) {
    buf = emitter->buf;
    sVar4 = buf->off;
    local_61 = 0xb;
    local_50 = key_sched;
    iVar1 = ptls_buffer__do_pushv(buf,&local_61,1);
    if (iVar1 == 0) {
      local_60 = emitter;
      local_58 = sVar4;
      iVar1 = ptls_buffer__do_pushv(buf,"",3);
      ppVar5 = local_60;
      if (iVar1 == 0) {
        sVar4 = buf->off;
        local_48 = 0;
        uStack_40 = 0;
        iVar1 = ptls_build_certificate_message
                          (local_60->buf,context,(tls->ctx->certificates).list,
                           (tls->ctx->certificates).count,(ptls_iovec_t)ZEXT816(0));
        if (iVar1 == 0) {
          uVar2 = buf->off - sVar4;
          for (lVar3 = 0x10; lVar3 != -8; lVar3 = lVar3 + -8) {
            buf->base[sVar4 - 3] = (uint8_t)(uVar2 >> ((byte)lVar3 & 0x3f));
            sVar4 = sVar4 + 1;
          }
          if (local_50 != (ptls_key_schedule_t *)0x0) {
            ptls__key_schedule_update_hash(local_50,buf->base + local_58,buf->off - local_58);
            ppVar5 = local_60;
          }
          iVar1 = (*ppVar5->commit_message)(ppVar5);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request,
                                       const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}